

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_parse_general_params(cmd_ln_t *config,fe_t *fe)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  double dVar5;
  int local_24;
  int frate;
  int j;
  fe_t *fe_local;
  cmd_ln_t *config_local;
  
  fe->config = config;
  dVar5 = cmd_ln_float_r(config,"-samprate");
  fe->sampling_rate = (float32)(float)dVar5;
  uVar2 = cmd_ln_int_r(config,"-frate");
  iVar1 = (int)uVar2;
  if (((0x7fff < iVar1) ||
      ((float)fe->sampling_rate <= (float)iVar1 && (float)iVar1 != (float)fe->sampling_rate)) ||
     (iVar1 < 1)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
            ,0x4a,"Frame rate %d can not be bigger than sample rate %.02f\n",
            (double)(float)fe->sampling_rate,uVar2 & 0xffffffff);
    config_local._4_4_ = -1;
  }
  else {
    fe->frame_rate = (int16)uVar2;
    lVar3 = cmd_ln_int_r(config,"-dither");
    if (lVar3 != 0) {
      fe->dither = '\x01';
      lVar3 = cmd_ln_int_r(config,"-seed");
      fe->dither_seed = (int32)lVar3;
    }
    pcVar4 = cmd_ln_str_r(config,"-input_endian");
    iVar1 = strcmp("little",pcVar4);
    fe->swap = iVar1 != 0;
    dVar5 = cmd_ln_float_r(config,"-wlen");
    fe->window_length = (float32)(float)dVar5;
    dVar5 = cmd_ln_float_r(config,"-alpha");
    fe->pre_emphasis_alpha = (float32)(float)dVar5;
    lVar3 = cmd_ln_int_r(config,"-ncep");
    fe->num_cepstra = (uint8)lVar3;
    lVar3 = cmd_ln_int_r(config,"-nfft");
    fe->fft_size = (int16)lVar3;
    local_24 = (int)fe->fft_size;
    fe->fft_order = '\0';
    while (1 < local_24) {
      if ((local_24 % 2 != 0) || (fe->fft_size < 1)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                ,0x62,"fft: number of points must be a power of 2 (is %d)\n",
                (ulong)(uint)(int)fe->fft_size);
        return -1;
      }
      local_24 = local_24 >> 1;
      fe->fft_order = fe->fft_order + '\x01';
    }
    if ((int)fe->fft_size < (int)((float)fe->window_length * (float)fe->sampling_rate)) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
              ,0x69,"FFT: Number of points must be greater or equal to frame size (%d samples)\n",
              (ulong)(uint)(int)((float)fe->window_length * (float)fe->sampling_rate));
      config_local._4_4_ = -1;
    }
    else {
      lVar3 = cmd_ln_int_r(config,"-vad_prespeech");
      fe->pre_speech = (int16)lVar3;
      lVar3 = cmd_ln_int_r(config,"-vad_postspeech");
      fe->post_speech = (int16)lVar3;
      lVar3 = cmd_ln_int_r(config,"-vad_startspeech");
      fe->start_speech = (int16)lVar3;
      dVar5 = cmd_ln_float_r(config,"-vad_threshold");
      fe->vad_threshold = (float32)(float)dVar5;
      lVar3 = cmd_ln_int_r(config,"-remove_dc");
      fe->remove_dc = lVar3 != 0;
      lVar3 = cmd_ln_int_r(config,"-remove_noise");
      fe->remove_noise = lVar3 != 0;
      lVar3 = cmd_ln_int_r(config,"-remove_silence");
      fe->remove_silence = lVar3 != 0;
      pcVar4 = cmd_ln_str_r(config,"-transform");
      iVar1 = strcmp(pcVar4,"dct");
      if (iVar1 == 0) {
        fe->transform = '\x01';
      }
      else {
        pcVar4 = cmd_ln_str_r(config,"-transform");
        iVar1 = strcmp(pcVar4,"legacy");
        if (iVar1 == 0) {
          fe->transform = '\0';
        }
        else {
          pcVar4 = cmd_ln_str_r(config,"-transform");
          iVar1 = strcmp(pcVar4,"htk");
          if (iVar1 != 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                    ,0x7d,"Invalid transform type (values are \'dct\', \'legacy\', \'htk\')\n");
            return -1;
          }
          fe->transform = '\x02';
        }
      }
      lVar3 = cmd_ln_int_r(config,"-logspec");
      if (lVar3 != 0) {
        fe->log_spec = '\x01';
      }
      lVar3 = cmd_ln_int_r(config,"-smoothspec");
      if (lVar3 != 0) {
        fe->log_spec = '\x02';
      }
      config_local._4_4_ = 0;
    }
  }
  return config_local._4_4_;
}

Assistant:

int
fe_parse_general_params(cmd_ln_t *config, fe_t * fe)
{
    int j, frate;

    fe->config = config;
    fe->sampling_rate = cmd_ln_float32_r(config, "-samprate");
    frate = cmd_ln_int32_r(config, "-frate");
    if (frate > MAX_INT16 || frate > fe->sampling_rate || frate < 1) {
        E_ERROR
            ("Frame rate %d can not be bigger than sample rate %.02f\n",
             frate, fe->sampling_rate);
        return -1;
    }

    fe->frame_rate = (int16)frate;
    if (cmd_ln_boolean_r(config, "-dither")) {
        fe->dither = 1;
        fe->dither_seed = cmd_ln_int32_r(config, "-seed");
    }
#ifdef WORDS_BIGENDIAN
    fe->swap = strcmp("big", cmd_ln_str_r(config, "-input_endian")) == 0 ? 0 : 1;
#else        
    fe->swap = strcmp("little", cmd_ln_str_r(config, "-input_endian")) == 0 ? 0 : 1;
#endif
    fe->window_length = cmd_ln_float32_r(config, "-wlen");
    fe->pre_emphasis_alpha = cmd_ln_float32_r(config, "-alpha");

    fe->num_cepstra = (uint8)cmd_ln_int32_r(config, "-ncep");
    fe->fft_size = (int16)cmd_ln_int32_r(config, "-nfft");

    /* Check FFT size, compute FFT order (log_2(n)) */
    for (j = fe->fft_size, fe->fft_order = 0; j > 1; j >>= 1, fe->fft_order++) {
        if (((j % 2) != 0) || (fe->fft_size <= 0)) {
            E_ERROR("fft: number of points must be a power of 2 (is %d)\n",
                    fe->fft_size);
            return -1;
        }
    }
    /* Verify that FFT size is greater or equal to window length. */
    if (fe->fft_size < (int)(fe->window_length * fe->sampling_rate)) {
        E_ERROR("FFT: Number of points must be greater or equal to frame size (%d samples)\n",
                (int)(fe->window_length * fe->sampling_rate));
        return -1;
    }

    fe->pre_speech = (int16)cmd_ln_int32_r(config, "-vad_prespeech");
    fe->post_speech = (int16)cmd_ln_int32_r(config, "-vad_postspeech");
    fe->start_speech = (int16)cmd_ln_int32_r(config, "-vad_startspeech");
    fe->vad_threshold = cmd_ln_float32_r(config, "-vad_threshold");

    fe->remove_dc = cmd_ln_boolean_r(config, "-remove_dc");
    fe->remove_noise = cmd_ln_boolean_r(config, "-remove_noise");
    fe->remove_silence = cmd_ln_boolean_r(config, "-remove_silence");

    if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "dct"))
        fe->transform = DCT_II;
    else if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "legacy"))
        fe->transform = LEGACY_DCT;
    else if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "htk"))
        fe->transform = DCT_HTK;
    else {
        E_ERROR("Invalid transform type (values are 'dct', 'legacy', 'htk')\n");
        return -1;
    }

    if (cmd_ln_boolean_r(config, "-logspec"))
        fe->log_spec = RAW_LOG_SPEC;
    if (cmd_ln_boolean_r(config, "-smoothspec"))
        fe->log_spec = SMOOTH_LOG_SPEC;

    return 0;
}